

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HessenbergDecomposition.h
# Opt level: O2

HouseholderSequenceType * __thiscall
Eigen::HessenbergDecomposition<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::matrixQ
          (HouseholderSequenceType *__return_storage_ptr__,
          HessenbergDecomposition<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this)

{
  long lVar1;
  
  if (this->m_isInitialized != false) {
    lVar1 = (this->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    __return_storage_ptr__->m_vectors = &this->m_matrix;
    __return_storage_ptr__->m_coeffs = &this->m_hCoeffs;
    __return_storage_ptr__->m_reverse = false;
    __return_storage_ptr__->m_length = lVar1 + -1;
    __return_storage_ptr__->m_shift = 1;
    return __return_storage_ptr__;
  }
  __assert_fail("m_isInitialized && \"HessenbergDecomposition is not initialized.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Eigenvalues/./HessenbergDecomposition.h"
                ,0xec,
                "HouseholderSequenceType Eigen::HessenbergDecomposition<Eigen::Matrix<double, -1, -1>>::matrixQ() const [_MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

HouseholderSequenceType matrixQ() const
    {
      eigen_assert(m_isInitialized && "HessenbergDecomposition is not initialized.");
      return HouseholderSequenceType(m_matrix, m_hCoeffs.conjugate())
             .setLength(m_matrix.rows() - 1)
             .setShift(1);
    }